

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

bool __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
try_push_leaf(iterator *this,olc_node_ptr aleaf,read_critical_section *rcs)

{
  stack_entry local_28;
  
  local_28.super_iter_result.key_byte = 0xff;
  local_28.super_iter_result.child_index = 0xff;
  local_28.super_iter_result.prefix.u64 = 0;
  local_28.version = (rcs->version).version;
  local_28.super_iter_result.node.tagged_ptr = aleaf.tagged_ptr;
  std::
  deque<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>
  ::
  emplace_back<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>
            ((deque<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>
              *)&this->stack_,&local_28);
  return true;
}

Assistant:

bool try_push_leaf(detail::olc_node_ptr aleaf,
                       const optimistic_lock::read_critical_section& rcs) {
      // The [key], [child_index] and [prefix] are ignored for a leaf.
      stack_.push({{aleaf,
                    static_cast<std::byte>(0xFFU),     // key_byte
                    static_cast<std::uint8_t>(0xFFU),  // child_index
                    detail::key_prefix_snapshot(0)},   // empty key_prefix
                   rcs.get()});
      return true;
    }